

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_proj.c
# Opt level: O0

int CVodeSetProjErrEst(void *cvode_mem,int onoff)

{
  undefined4 in_ESI;
  CVodeProjMem proj_mem;
  CVodeMem cv_mem;
  int retval;
  CVodeMem *in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 local_4;
  
  local_4 = cvAccessProjMem((void *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                            in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                            (CVodeProjMem *)0x143ea6);
  if (local_4 == 0) {
    *(undefined4 *)((long)in_stack_ffffffffffffffd8 + 4) = in_ESI;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int CVodeSetProjErrEst(void* cvode_mem, sunbooleantype onoff)
{
  int retval;
  CVodeMem cv_mem;
  CVodeProjMem proj_mem;

  /* Access memory structures */
  retval = cvAccessProjMem(cvode_mem, __func__, &cv_mem, &proj_mem);
  if (retval != CV_SUCCESS) { return (retval); }

  /* Set projection error flag */
  proj_mem->err_proj = onoff;

  return (CV_SUCCESS);
}